

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTaskScheduler.cpp
# Opt level: O1

void __thiscall JobQueue::clearQueue(JobQueue *this,int jobCount,int jobSize)

{
  IJob **ptr;
  IJob **ppIVar1;
  long lVar2;
  long lVar3;
  
  if (this->m_useSpinMutex == true) {
    cbtSpinMutex::lock(&this->m_mutex);
  }
  else {
    (*this->m_queueLock->_vptr_cbtCriticalSection[2])();
  }
  this->m_tailIndex = 0;
  this->m_headIndex = 0;
  this->m_allocSize = 0;
  this->m_queueIsEmpty = true;
  if (this->m_jobMemSize < jobSize * jobCount) {
    resizeJobMem(this,jobSize * jobCount);
  }
  if ((this->m_jobQueue).m_capacity < jobCount) {
    if (jobCount == 0) {
      ppIVar1 = (IJob **)0x0;
    }
    else {
      ppIVar1 = (IJob **)cbtAlignedAllocInternal((long)jobCount << 3,0x10);
    }
    lVar2 = (long)(this->m_jobQueue).m_size;
    if (0 < lVar2) {
      lVar3 = 0;
      do {
        ppIVar1[lVar3] = (this->m_jobQueue).m_data[lVar3];
        lVar3 = lVar3 + 1;
      } while (lVar2 != lVar3);
    }
    ptr = (this->m_jobQueue).m_data;
    if (ptr != (IJob **)0x0) {
      if ((this->m_jobQueue).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ptr);
      }
      (this->m_jobQueue).m_data = (IJob **)0x0;
    }
    (this->m_jobQueue).m_ownsMemory = true;
    (this->m_jobQueue).m_data = ppIVar1;
    (this->m_jobQueue).m_capacity = jobCount;
  }
  if (this->m_useSpinMutex == true) {
    cbtSpinMutex::unlock(&this->m_mutex);
  }
  else {
    (*this->m_queueLock->_vptr_cbtCriticalSection[3])();
  }
  if (((this->m_jobQueue).m_size < 0) && ((this->m_jobQueue).m_capacity < 0)) {
    ppIVar1 = (this->m_jobQueue).m_data;
    if (ppIVar1 != (IJob **)0x0) {
      if ((this->m_jobQueue).m_ownsMemory == true) {
        cbtAlignedFreeInternal(ppIVar1);
      }
      (this->m_jobQueue).m_data = (IJob **)0x0;
    }
    (this->m_jobQueue).m_ownsMemory = true;
    (this->m_jobQueue).m_data = (IJob **)0x0;
    (this->m_jobQueue).m_capacity = 0;
  }
  (this->m_jobQueue).m_size = 0;
  return;
}

Assistant:

void clearQueue(int jobCount, int jobSize)
	{
		lockQueue();
		m_headIndex = 0;
		m_tailIndex = 0;
		m_allocSize = 0;
		m_queueIsEmpty = true;
		int jobBufSize = jobSize * jobCount;
		// make sure we have enough memory allocated to store jobs
		if (jobBufSize > m_jobMemSize)
		{
			resizeJobMem(jobBufSize);
		}
		// make sure job queue is big enough
		if (jobCount > m_jobQueue.capacity())
		{
			m_jobQueue.reserve(jobCount);
		}
		unlockQueue();
		m_jobQueue.resizeNoInitialize(0);
	}